

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
vector<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
::vector(vector<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         *this,size_t count,
        optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *value,polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *alloc)

{
  string *psVar1;
  bool bVar2;
  optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *poVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->ptr = (optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  reserve(this,count);
  if (count != 0) {
    lVar6 = 0x18;
    sVar5 = count;
    do {
      poVar3 = this->ptr;
      bVar2 = value->set;
      (poVar3->optionalValue).__data[lVar6 + 0x10] = bVar2;
      if (bVar2 == true) {
        psVar1 = (string *)((long)poVar3 + lVar6 + -0x10);
        *(undefined4 *)(psVar1 + -8) = *(undefined4 *)&value->optionalValue;
        *(uchar **)psVar1 = (poVar3->optionalValue).__data + lVar6;
        lVar4 = *(long *)((long)&value->optionalValue + 8);
        std::__cxx11::string::_M_construct<char*>
                  (psVar1,lVar4,*(long *)((long)&value->optionalValue + 0x10) + lVar4);
      }
      lVar6 = lVar6 + 0x30;
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
  }
  this->nStored = count;
  return;
}

Assistant:

vector(size_t count, const T &value, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(ptr + i, value);
        nStored = count;
    }